

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

int xmlRelaxNGInitTypes(void)

{
  int iVar1;
  xmlRelaxNGTypeFree unaff_RBX;
  
  iVar1 = 0;
  if (xmlRelaxNGTypeInitialized == '\0') {
    xmlRelaxNGRegisteredTypes = xmlHashCreate(10);
    if (xmlRelaxNGRegisteredTypes == (xmlHashTablePtr)0x0) {
      iVar1 = -1;
    }
    else {
      xmlRelaxNGRegisterTypeLibrary
                ((xmlChar *)"http://www.w3.org/2001/XMLSchema-datatypes",xmlRelaxNGSchemaTypeHave,
                 xmlRelaxNGSchemaTypeCheck,xmlRelaxNGSchemaTypeCompare,xmlRelaxNGSchemaFacetCheck,
                 xmlRelaxNGSchemaFreeValue,unaff_RBX);
      iVar1 = 0;
      xmlRelaxNGRegisterTypeLibrary
                ((xmlChar *)"http://relaxng.org/ns/structure/1.0",xmlRelaxNGDefaultTypeHave,
                 xmlRelaxNGDefaultTypeCheck,xmlRelaxNGDefaultTypeCompare,(xmlRelaxNGTypeCompare)0x0,
                 (xmlRelaxNGFacetCheck)0x0,unaff_RBX);
      xmlRelaxNGTypeInitialized = '\x01';
    }
  }
  return iVar1;
}

Assistant:

int
xmlRelaxNGInitTypes(void)
{
    if (xmlRelaxNGTypeInitialized != 0)
        return (0);
    xmlRelaxNGRegisteredTypes = xmlHashCreate(10);
    if (xmlRelaxNGRegisteredTypes == NULL)
        return (-1);
    xmlRelaxNGRegisterTypeLibrary(BAD_CAST
                                  "http://www.w3.org/2001/XMLSchema-datatypes",
                                  NULL, xmlRelaxNGSchemaTypeHave,
                                  xmlRelaxNGSchemaTypeCheck,
                                  xmlRelaxNGSchemaTypeCompare,
                                  xmlRelaxNGSchemaFacetCheck,
                                  xmlRelaxNGSchemaFreeValue);
    xmlRelaxNGRegisterTypeLibrary(xmlRelaxNGNs, NULL,
                                  xmlRelaxNGDefaultTypeHave,
                                  xmlRelaxNGDefaultTypeCheck,
                                  xmlRelaxNGDefaultTypeCompare, NULL,
                                  NULL);
    xmlRelaxNGTypeInitialized = 1;
    return (0);
}